

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverLS.cpp
# Opt level: O2

bool __thiscall chrono::ChSolverMINRES::SolveProblem(ChSolverMINRES *this)

{
  ChVectorDynamic<double> *b;
  double dVar1;
  ComputationInfo CVar2;
  long lVar3;
  ostream *poVar4;
  RealScalar RVar5;
  SolveWithGuess<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_28;
  
  lVar3 = (long)(this->super_ChIterativeSolverLS).super_ChIterativeSolver.m_max_iterations;
  if (0 < lVar3) {
    (this->m_engine->
    super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
    ).m_maxIterations = lVar3;
  }
  dVar1 = (this->super_ChIterativeSolverLS).super_ChIterativeSolver.m_tolerance;
  if (0.0 < dVar1) {
    (this->m_engine->
    super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
    ).m_tolerance = dVar1;
  }
  b = &(this->super_ChIterativeSolverLS).m_rhs;
  if ((this->super_ChIterativeSolverLS).super_ChIterativeSolver.m_warm_start == true) {
    Eigen::
    IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,3,chrono::ChDiagonalPreconditioner>>::
    solveWithGuess<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&local_28,
               (IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,3,chrono::ChDiagonalPreconditioner>>
                *)this->m_engine,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)b,
               &(this->super_ChIterativeSolverLS).m_initguess);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::SolveWithGuess<Eigen::MINRES<chrono::ChMatrixSPMV,3,chrono::ChDiagonalPreconditioner>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              (&(this->super_ChIterativeSolverLS).m_sol,&local_28);
  }
  else {
    local_28._0_16_ =
         Eigen::
         SparseSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,3,chrono::ChDiagonalPreconditioner>>::
         solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                   ((SparseSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,3,chrono::ChDiagonalPreconditioner>>
                     *)this->m_engine,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)b);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::MINRES<chrono::ChMatrixSPMV,3,chrono::ChDiagonalPreconditioner>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              (&(this->super_ChIterativeSolverLS).m_sol,
               (Solve<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&local_28);
  }
  if ((this->super_ChIterativeSolverLS).super_ChSolverLS.super_ChSolver.verbose == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"  MINRES iterations: ");
    Eigen::
    IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>::
    iterations(&this->m_engine->
                super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
              );
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::operator<<(poVar4," error: ");
    RVar5 = Eigen::
            IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
            ::error(&this->m_engine->
                     super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
                   );
    poVar4 = std::ostream::_M_insert<double>(RVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  CVar2 = Eigen::
          IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
          ::info(&this->m_engine->
                  super_IterativeSolverBase<Eigen::MINRES<chrono::ChMatrixSPMV,_3,_chrono::ChDiagonalPreconditioner>_>
                );
  return CVar2 == Success;
}

Assistant:

bool ChSolverMINRES::SolveProblem() {
    if (m_max_iterations > 0) {
        m_engine->setMaxIterations(m_max_iterations);
    }
    if (m_tolerance > 0) {
        m_engine->setTolerance(m_tolerance);
    }

    if (m_warm_start) {
        m_sol = m_engine->solveWithGuess(m_rhs, m_initguess);
    } else {
        m_sol = m_engine->solve(m_rhs);
    }

    if (verbose) {
        std::cout << "  MINRES iterations: " << m_engine->iterations() << " error: " << m_engine->error() << std::endl;
    }

    return (m_engine->info() == Eigen::Success);
}